

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int dotlockLock(sqlite3_file *id,int eFileLock)

{
  int posixError;
  int *piVar1;
  uchar in_SIL;
  unixFile *in_RDI;
  int tErrno;
  int rc;
  char *zLockFile;
  unixFile *pFile;
  int local_2c;
  int local_4;
  
  if (in_RDI->eFileLock == '\0') {
    local_4 = (*aSyscall[0x12].pCurrent)(in_RDI->lockingContext,0x1ff);
    if (local_4 < 0) {
      piVar1 = __errno_location();
      posixError = *piVar1;
      if (posixError == 0x11) {
        local_2c = 5;
      }
      else {
        local_2c = sqliteErrorFromPosixError(posixError,0xf0a);
        if (local_2c != 5) {
          storeLastErrno(in_RDI,posixError);
        }
      }
      local_4 = local_2c;
    }
    else {
      in_RDI->eFileLock = in_SIL;
    }
  }
  else {
    in_RDI->eFileLock = in_SIL;
    utimes((char *)in_RDI->lockingContext,(timeval *)0x0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int dotlockLock(sqlite3_file *id, int eFileLock) {
  unixFile *pFile = (unixFile*)id;
  char *zLockFile = (char *)pFile->lockingContext;
  int rc = SQLITE_OK;


  /* If we have any lock, then the lock file already exists.  All we have
  ** to do is adjust our internal record of the lock level.
  */
  if( pFile->eFileLock > NO_LOCK ){
    pFile->eFileLock = eFileLock;
    /* Always update the timestamp on the old file */
#ifdef HAVE_UTIME
    utime(zLockFile, NULL);
#else
    utimes(zLockFile, NULL);
#endif
    return SQLITE_OK;
  }

  /* grab an exclusive lock */
  rc = osMkdir(zLockFile, 0777);
  if( rc<0 ){
    /* failed to open/create the lock directory */
    int tErrno = errno;
    if( EEXIST == tErrno ){
      rc = SQLITE_BUSY;
    } else {
      rc = sqliteErrorFromPosixError(tErrno, SQLITE_IOERR_LOCK);
      if( rc!=SQLITE_BUSY ){
        storeLastErrno(pFile, tErrno);
      }
    }
    return rc;
  }

  /* got it, set the type and return ok */
  pFile->eFileLock = eFileLock;
  return rc;
}